

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

socket_config * extend_socket_config(void)

{
  long lVar1;
  socket_config *psVar2;
  long in_FS_OFFSET;
  socket_config *config;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socket_config = (socket_config **)checked_realloc(socket_config,socket_count * 8 + 8);
  psVar2 = (socket_config *)checked_malloc(0xd8);
  socket_config[socket_count] = psVar2;
  psVar2->bindaddr = (char *)0x0;
  psVar2->host = (char *)0x0;
  (psVar2->tr_socket).ident_fp = (tr_ident_fp)0x0;
  psVar2->type = SOCKET_TYPE_TCP;
  psVar2->print_pfx_updates = false;
  psVar2->print_spki_updates = false;
  psVar2->print_aspa_updates = false;
  psVar2->field_0xbf = 0;
  (psVar2->tr_socket).send_fp = (tr_send_fp)0x0;
  (psVar2->tr_socket).recv_fp = (tr_recv_fp)0x0;
  (psVar2->tr_socket).close_fp = (tr_close_fp)0x0;
  (psVar2->tr_socket).free_fp = (tr_free_fp)0x0;
  (psVar2->tr_socket).socket = (void *)0x0;
  (psVar2->tr_socket).open_fp = (tr_open_fp)0x0;
  (psVar2->socket).aspa_table = (aspa_table *)0x0;
  *(undefined8 *)&(psVar2->socket).is_resetting = 0;
  (psVar2->socket).version = 0;
  (psVar2->socket).has_received_pdus = false;
  *(undefined3 *)&(psVar2->socket).field_0x65 = 0;
  (psVar2->socket).spki_table = (spki_table *)0x0;
  (psVar2->socket).connection_state_fp_param_config = (void *)0x0;
  (psVar2->socket).connection_state_fp_param_group = (void *)0x0;
  (psVar2->socket).thread_id = 0;
  (psVar2->socket).connection_state_fp = (rtr_connection_state_fp)0x0;
  *(undefined8 *)&(psVar2->socket).serial_number = 0;
  (psVar2->socket).pfx_table = (pfx_table *)0x0;
  (psVar2->socket).iv_mode = RTR_INTERVAL_MODE_IGNORE_ANY;
  (psVar2->socket).state = RTR_CONNECTING;
  (psVar2->socket).session_id = 0;
  (psVar2->socket).request_session_id = false;
  *(undefined3 *)&(psVar2->socket).field_0x2d = 0;
  (psVar2->socket).last_update = 0;
  (psVar2->socket).expire_interval = 0;
  (psVar2->socket).retry_interval = 0;
  (psVar2->socket).tr_socket = (tr_socket *)0x0;
  *(undefined8 *)&(psVar2->socket).refresh_interval = 0;
  psVar2->port = (char *)0x0;
  socket_count = socket_count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static struct socket_config *extend_socket_config()
{
	socket_config = checked_realloc(socket_config, sizeof(struct socket_config *) * (socket_count + 1));
	struct socket_config *config = socket_config[socket_count] = checked_malloc(sizeof(struct socket_config));

	memset(config, 0, sizeof(*config));
	++socket_count;

	return config;
}